

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O2

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::EliminateZeroCoefficientRecurrents
          (SENodeSimplifyImpl *this,SENode *node)

{
  long *plVar1;
  ScalarEvolutionAnalysis *pSVar2;
  SENodeSimplifyImpl *pSVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_> tVar7;
  pointer ppSVar8;
  pointer ppSVar9;
  SENode *__range2;
  SENode *child;
  SENodeSimplifyImpl *local_60;
  __uniq_ptr_impl<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_58;
  SENode *local_50;
  _Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> local_48;
  
  iVar5 = (**node->_vptr_SENode)(node);
  if (iVar5 == 2) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppSVar8 = (node->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar4 = false;
    local_60 = this;
    for (ppSVar9 = (node->children_).
                   super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppSVar9 != ppSVar8;
        ppSVar9 = ppSVar9 + 1) {
      child = *ppSVar9;
      iVar5 = (**child->_vptr_SENode)();
      if (iVar5 == 1) {
        iVar5 = (*child->_vptr_SENode[6])();
        plVar1 = *(long **)(CONCAT44(extraout_var,iVar5) + 0x30);
        iVar5 = (**(code **)*plVar1)(plVar1);
        if (iVar5 != 0) goto LAB_004fdc77;
        lVar6 = (**(code **)(*plVar1 + 0x20))(plVar1);
        if (*(long *)(lVar6 + 0x30) != 0) goto LAB_004fdc77;
        iVar5 = (*child->_vptr_SENode[6])();
        local_50 = *(SENode **)(CONCAT44(extraout_var_00,iVar5) + 0x38);
        std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>::
        emplace_back<spvtools::opt::SENode*>
                  ((vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>> *)
                   &local_48,&local_50);
        bVar4 = true;
      }
      else {
LAB_004fdc77:
        std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::push_back
                  ((vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *)
                   &local_48,&child);
      }
    }
    if (bVar4) {
      tVar7.
      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
           ::operator_new(0x30);
      ppSVar9 = local_48._M_impl.super__Vector_impl_data._M_finish;
      pSVar3 = local_60;
      pSVar2 = local_60->node_->parent_analysis_;
      *(long *)((long)tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x18) =
           0;
      *(long *)((long)tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 8) = 0;
      *(long *)((long)tVar7.
                      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                      .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x10) =
           0;
      *(ScalarEvolutionAnalysis **)
       ((long)tVar7.
              super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
              .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x20) = pSVar2;
      SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
      *(int *)((long)tVar7.
                     super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                     .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl + 0x28) =
           SENode::NumberOfNodes;
      *(undefined ***)
       tVar7.
       super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
       super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl = &PTR_GetType_00a71208;
      for (ppSVar8 = local_48._M_impl.super__Vector_impl_data._M_start; ppSVar8 != ppSVar9;
          ppSVar8 = ppSVar8 + 1) {
        (**(code **)(*(long *)tVar7.
                              super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                              .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl +
                    0x18))(tVar7.
                           super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                           .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl,
                           *ppSVar8);
      }
      local_58._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
           (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
           (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
           tVar7.
           super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
           .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl;
      node = ScalarEvolutionAnalysis::GetCachedOrAdd
                       (pSVar3->analysis_,
                        (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                         *)&local_58);
      if ((_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
          local_58._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
          .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl != (SENode *)0x0) {
        (**(code **)(*(long *)local_58._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>
                              .super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl +
                    0x10))();
      }
      local_58._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>.
      super__Head_base<0UL,_spvtools::opt::SENode_*,_false>._M_head_impl =
           (tuple<spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
           (_Tuple_impl<0UL,_spvtools::opt::SENode_*,_std::default_delete<spvtools::opt::SENode>_>)
           0x0;
    }
    std::_Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::
    ~_Vector_base(&local_48);
  }
  return node;
}

Assistant:

SENode* SENodeSimplifyImpl::EliminateZeroCoefficientRecurrents(SENode* node) {
  if (node->GetType() != SENode::Add) return node;

  bool has_change = false;

  std::vector<SENode*> new_children{};
  for (SENode* child : *node) {
    if (child->GetType() == SENode::RecurrentAddExpr) {
      SENode* coefficient = child->AsSERecurrentNode()->GetCoefficient();
      // If coefficient is zero then we can eliminate the recurrent expression
      // entirely and just return the offset as the recurrent expression is
      // representing the equation coefficient*iterations + offset.
      if (coefficient->GetType() == SENode::Constant &&
          coefficient->AsSEConstantNode()->FoldToSingleValue() == 0) {
        new_children.push_back(child->AsSERecurrentNode()->GetOffset());
        has_change = true;
      } else {
        new_children.push_back(child);
      }
    } else {
      new_children.push_back(child);
    }
  }

  if (!has_change) return node;

  std::unique_ptr<SENode> new_add{new SEAddNode(node_->GetParentAnalysis())};

  for (SENode* child : new_children) {
    new_add->AddChild(child);
  }

  return analysis_.GetCachedOrAdd(std::move(new_add));
}